

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O0

bool __thiscall ON_NurbsCurve::GetGrevilleAbcissae(ON_NurbsCurve *this,double *g)

{
  bool bVar1;
  double *g_local;
  ON_NurbsCurve *this_local;
  
  bVar1 = ON_GetGrevilleAbcissae(this->m_order,this->m_cv_count,this->m_knot,false,g);
  return bVar1;
}

Assistant:

bool ON_NurbsCurve::GetGrevilleAbcissae( // see ON_GetGrevilleAbcissa() for details
         double* g         // g[m_cv_count]
         ) const
{
  // The "false" for the 4th parameter is on purpose and should not be
  // replaced with this->IsPeriodic().  The problem
  // being that when the 4th parameter is true, it is not possible
  // to determine which subset of the full list of Greville abcissae
  // was returned.
  return ON_GetGrevilleAbcissae( m_order, m_cv_count, m_knot, false, g );
}